

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escape.c
# Opt level: O2

CURLcode Curl_urldecode(Curl_easy *data,char *string,size_t length,char **ostring,size_t *olen,
                       _Bool reject_ctrl)

{
  byte *pbVar1;
  byte *pbVar2;
  byte bVar3;
  CURLcode CVar4;
  char *pcVar5;
  ushort **ppuVar6;
  ulong uVar7;
  size_t sVar8;
  size_t sVar9;
  char hexstr [3];
  char *ptr;
  
  if (length == 0) {
    length = strlen(string);
  }
  pcVar5 = (char *)(*Curl_cmalloc)(length + 1);
  if (pcVar5 == (char *)0x0) {
    CVar4 = CURLE_OUT_OF_MEMORY;
  }
  else {
    sVar8 = 0;
    sVar9 = length + 1;
    while (uVar7 = sVar9 - 1, uVar7 != 0) {
      bVar3 = *string;
      if ((uVar7 < 3) || (bVar3 != 0x25)) {
LAB_0057b2d6:
        if ((reject_ctrl) && (bVar3 < 0x20)) {
          (*Curl_cfree)(pcVar5);
          return CURLE_URL_MALFORMAT;
        }
      }
      else {
        ppuVar6 = __ctype_b_loc();
        pbVar1 = (byte *)string + 1;
        bVar3 = 0x25;
        if (((*(byte *)((long)*ppuVar6 + (ulong)*pbVar1 * 2 + 1) & 0x10) != 0) &&
           (pbVar2 = (byte *)string + 2,
           (*(byte *)((long)*ppuVar6 + (ulong)*pbVar2 * 2 + 1) & 0x10) != 0)) {
          string = (char *)((byte *)string + 2);
          hexstr[2] = '\0';
          hexstr[0] = *pbVar1;
          hexstr[1] = *pbVar2;
          uVar7 = strtoul(hexstr,&ptr,0x10);
          bVar3 = curlx_ultouc(uVar7);
          uVar7 = sVar9 - 3;
          goto LAB_0057b2d6;
        }
      }
      pcVar5[sVar8] = bVar3;
      sVar8 = sVar8 + 1;
      string = (char *)((byte *)string + 1);
      sVar9 = uVar7;
    }
    pcVar5[sVar8] = '\0';
    if (olen != (size_t *)0x0) {
      *olen = sVar8;
    }
    *ostring = pcVar5;
    CVar4 = CURLE_OK;
  }
  return CVar4;
}

Assistant:

CURLcode Curl_urldecode(struct Curl_easy *data,
                        const char *string, size_t length,
                        char **ostring, size_t *olen,
                        bool reject_ctrl)
{
  size_t alloc = (length?length:strlen(string))+1;
  char *ns = malloc(alloc);
  unsigned char in;
  size_t strindex=0;
  unsigned long hex;
  CURLcode result;

  if(!ns)
    return CURLE_OUT_OF_MEMORY;

  while(--alloc > 0) {
    in = *string;
    if(('%' == in) && (alloc > 2) &&
       ISXDIGIT(string[1]) && ISXDIGIT(string[2])) {
      /* this is two hexadecimal digits following a '%' */
      char hexstr[3];
      char *ptr;
      hexstr[0] = string[1];
      hexstr[1] = string[2];
      hexstr[2] = 0;

      hex = strtoul(hexstr, &ptr, 16);

      in = curlx_ultouc(hex); /* this long is never bigger than 255 anyway */

      result = Curl_convert_from_network(data, &in, 1);
      if(result) {
        /* Curl_convert_from_network calls failf if unsuccessful */
        free(ns);
        return result;
      }

      string+=2;
      alloc-=2;
    }

    if(reject_ctrl && (in < 0x20)) {
      free(ns);
      return CURLE_URL_MALFORMAT;
    }

    ns[strindex++] = in;
    string++;
  }
  ns[strindex]=0; /* terminate it */

  if(olen)
    /* store output size */
    *olen = strindex;

  /* store output string */
  *ostring = ns;

  return CURLE_OK;
}